

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O0

void __thiscall deqp::gls::BuiltinPrecisionTests::Functions::Abs::~Abs(Abs *this)

{
  Abs *this_local;
  
  ~Abs(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

Abs (void) : PreciseFunc1("abs", deAbs) {}